

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

string * tinygltf::MimeToExt(string *__return_storage_ptr__,string *mimeType)

{
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  bVar1 = std::operator==(mimeType,"image/jpeg");
  if (bVar1) {
    pcVar3 = "jpg";
    paVar2 = &local_11;
  }
  else {
    bVar1 = std::operator==(mimeType,"image/png");
    if (bVar1) {
      pcVar3 = "png";
      paVar2 = &local_12;
    }
    else {
      bVar1 = std::operator==(mimeType,"image/bmp");
      if (bVar1) {
        pcVar3 = "bmp";
        paVar2 = &local_13;
      }
      else {
        bVar1 = std::operator==(mimeType,"image/gif");
        if (bVar1) {
          pcVar3 = "gif";
          paVar2 = &local_14;
        }
        else {
          pcVar3 = "";
          paVar2 = &local_15;
        }
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string MimeToExt(const std::string &mimeType) {
  if (mimeType == "image/jpeg") {
    return "jpg";
  } else if (mimeType == "image/png") {
    return "png";
  } else if (mimeType == "image/bmp") {
    return "bmp";
  } else if (mimeType == "image/gif") {
    return "gif";
  }

  return "";
}